

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-regex.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *find_text;
  int eof;
  strbuffer_t buffer;
  
  if (argc < 2) {
    strbuffer_init(&buffer,0x50,10);
    find_text = strbuffer_getline(&buffer,&eof);
    process_regex(find_text,"(\\w+)");
    free(find_text);
  }
  else {
    process_regex(argv[1],"(\\w+)");
  }
  return 0;
}

Assistant:

int main (int argc, char ** argv)
{
    int eof;
    const char * regex_text = WORD_REGEX;

    // if no arguments read text from stdin; else use argv[1] as text
    if (argc < 2)
    {
        strbuffer_t buffer;
        strbuffer_init(&buffer, 80, 10);
        char* line = strbuffer_getline(&buffer, &eof);
        process_regex(line, regex_text);
        if (line) free(line);
    }
    else
    {
        process_regex(argv[1], regex_text);
    }
    return 0;
}